

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_set_cursor(_Bool v)

{
  bool bVar1;
  
  bVar1 = Term->scr->cv == v;
  if (!bVar1) {
    Term->scr->cv = v;
  }
  return (uint)bVar1;
}

Assistant:

errr Term_set_cursor(bool v)
{
	/* Already done */
	if (Term->scr->cv == v) return (1);

	/* Change */
	Term->scr->cv = v;

	/* Success */
	return (0);
}